

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O3

float deqp::gles3::Performance::vectorFloatFirstQuartile<long>
                (vector<long,_std::allocator<long>_> *v)

{
  float fVar1;
  vector<long,_std::allocator<long>_> local_20;
  
  vectorLowestPercentage<long>(&local_20,v,0.5);
  fVar1 = vectorFloatMedian<long>(&local_20);
  if (local_20.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return fVar1;
}

Assistant:

static float vectorFloatFirstQuartile (const vector<T>& v)
{
	return vectorFloatMedian(vectorLowestPercentage(v, 0.5f));
}